

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void idct16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  iVar7 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar8._16_4_ = uVar1;
  auVar8._20_4_ = uVar1;
  auVar8._24_4_ = uVar1;
  auVar8._28_4_ = uVar1;
  auVar8 = vpmulld_avx2(auVar8,(undefined1  [32])*in);
  auVar10._4_4_ = iVar7;
  auVar10._0_4_ = iVar7;
  auVar10._8_4_ = iVar7;
  auVar10._12_4_ = iVar7;
  auVar10._16_4_ = iVar7;
  auVar10._20_4_ = iVar7;
  auVar10._24_4_ = iVar7;
  auVar10._28_4_ = iVar7;
  auVar8 = vpaddd_avx2(auVar8,auVar10);
  iVar6 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar7 = 0x8000;
  if (0xf < iVar6) {
    iVar7 = 1 << ((char)iVar6 - 1U & 0x1f);
  }
  auVar8 = vpsrad_avx2(auVar8,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    iVar7 = 0x20 << ((byte)iVar7 & 0x1f);
    iVar6 = -iVar7;
    auVar9._4_4_ = iVar6;
    auVar9._0_4_ = iVar6;
    auVar9._8_4_ = iVar6;
    auVar9._12_4_ = iVar6;
    auVar9._16_4_ = iVar6;
    auVar9._20_4_ = iVar6;
    auVar9._24_4_ = iVar6;
    auVar9._28_4_ = iVar6;
    iVar7 = iVar7 + -1;
    auVar11._4_4_ = iVar7;
    auVar11._0_4_ = iVar7;
    auVar11._8_4_ = iVar7;
    auVar11._12_4_ = iVar7;
    auVar11._16_4_ = iVar7;
    auVar11._20_4_ = iVar7;
    auVar11._24_4_ = iVar7;
    auVar11._28_4_ = iVar7;
    iVar7 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar12._4_4_ = iVar7;
    auVar12._0_4_ = iVar7;
    auVar12._8_4_ = iVar7;
    auVar12._12_4_ = iVar7;
    auVar12._16_4_ = iVar7;
    auVar12._20_4_ = iVar7;
    auVar12._24_4_ = iVar7;
    auVar12._28_4_ = iVar7;
    auVar8 = vpaddd_avx2(auVar8,auVar12);
    auVar8 = vpsrad_avx2(auVar8,ZEXT416((uint)out_shift));
  }
  else {
    iVar6 = -iVar7;
    iVar7 = iVar7 + -1;
    auVar9._4_4_ = iVar6;
    auVar9._0_4_ = iVar6;
    auVar9._8_4_ = iVar6;
    auVar9._12_4_ = iVar6;
    auVar9._16_4_ = iVar6;
    auVar9._20_4_ = iVar6;
    auVar9._24_4_ = iVar6;
    auVar9._28_4_ = iVar6;
    auVar11._4_4_ = iVar7;
    auVar11._0_4_ = iVar7;
    auVar11._8_4_ = iVar7;
    auVar11._12_4_ = iVar7;
    auVar11._16_4_ = iVar7;
    auVar11._20_4_ = iVar7;
    auVar11._24_4_ = iVar7;
    auVar11._28_4_ = iVar7;
  }
  auVar8 = vpmaxsd_avx2(auVar8,auVar9);
  alVar2 = (__m256i)vpminsd_avx2(auVar8,auVar11);
  *in = alVar2;
  *out = alVar2;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[1][0] = (*in)[0];
  out[1][1] = lVar3;
  out[1][2] = lVar4;
  out[1][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[2][0] = (*in)[0];
  out[2][1] = lVar3;
  out[2][2] = lVar4;
  out[2][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[3][0] = (*in)[0];
  out[3][1] = lVar3;
  out[3][2] = lVar4;
  out[3][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[4][0] = (*in)[0];
  out[4][1] = lVar3;
  out[4][2] = lVar4;
  out[4][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[5][0] = (*in)[0];
  out[5][1] = lVar3;
  out[5][2] = lVar4;
  out[5][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[6][0] = (*in)[0];
  out[6][1] = lVar3;
  out[6][2] = lVar4;
  out[6][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[7][0] = (*in)[0];
  out[7][1] = lVar3;
  out[7][2] = lVar4;
  out[7][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[8][0] = (*in)[0];
  out[8][1] = lVar3;
  out[8][2] = lVar4;
  out[8][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[9][0] = (*in)[0];
  out[9][1] = lVar3;
  out[9][2] = lVar4;
  out[9][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[10][0] = (*in)[0];
  out[10][1] = lVar3;
  out[10][2] = lVar4;
  out[10][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xb][0] = (*in)[0];
  out[0xb][1] = lVar3;
  out[0xb][2] = lVar4;
  out[0xb][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xc][0] = (*in)[0];
  out[0xc][1] = lVar3;
  out[0xc][2] = lVar4;
  out[0xc][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xd][0] = (*in)[0];
  out[0xd][1] = lVar3;
  out[0xd][2] = lVar4;
  out[0xd][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xe][0] = (*in)[0];
  out[0xe][1] = lVar3;
  out[0xe][2] = lVar4;
  out[0xe][3] = lVar5;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xf][0] = (*in)[0];
  out[0xf][1] = lVar3;
  out[0xf][2] = lVar4;
  out[0xf][3] = lVar5;
  return;
}

Assistant:

static void idct16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  {
    // stage 0
    // stage 1
    // stage 2
    // stage 3
    // stage 4
    in[0] = _mm256_mullo_epi32(in[0], cospi32);
    in[0] = _mm256_add_epi32(in[0], rnding);
    in[0] = _mm256_srai_epi32(in[0], bit);

    // stage 5
    // stage 6
    // stage 7
    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      clamp_lo = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      clamp_hi = _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
      __m256i offset = _mm256_set1_epi32((1 << out_shift) >> 1);
      in[0] = _mm256_add_epi32(in[0], offset);
      in[0] = _mm256_sra_epi32(in[0], _mm_cvtsi32_si128(out_shift));
    }
    in[0] = _mm256_max_epi32(in[0], clamp_lo);
    in[0] = _mm256_min_epi32(in[0], clamp_hi);
    out[0] = in[0];
    out[1] = in[0];
    out[2] = in[0];
    out[3] = in[0];
    out[4] = in[0];
    out[5] = in[0];
    out[6] = in[0];
    out[7] = in[0];
    out[8] = in[0];
    out[9] = in[0];
    out[10] = in[0];
    out[11] = in[0];
    out[12] = in[0];
    out[13] = in[0];
    out[14] = in[0];
    out[15] = in[0];
  }
}